

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  GCObject *pGVar1;
  global_State *p_00;
  int iVar2;
  long lVar3;
  CallInfo *local_80;
  CallInfo *local_78;
  int n;
  CallInfo *ci_1;
  int nargs;
  Proto *p;
  StkId base;
  StkId st;
  CallInfo *ci;
  ptrdiff_t funcr;
  LClosure *cl;
  StkId pTStack_20;
  int nresults_local;
  StkId func_local;
  lua_State *L_local;
  
  pTStack_20 = func;
  if (func->tt != 6) {
    pTStack_20 = tryfuncTM(L,func);
  }
  lVar3 = (long)pTStack_20 - (long)L->stack;
  pGVar1 = (pTStack_20->value).gc;
  L->ci->savedpc = L->savedpc;
  if ((pGVar1->h).flags == '\0') {
    p_00 = (pGVar1->th).l_G;
    if ((long)L->stack_last - (long)L->top <=
        (long)(int)(((uint)*(lu_byte *)((long)&p_00->GCthreshold + 3) +
                    (uint)*(lu_byte *)((long)&p_00->GCthreshold + 1)) * 0x10)) {
      luaD_growstack(L,(uint)*(lu_byte *)((long)&p_00->GCthreshold + 3) +
                       (uint)*(lu_byte *)((long)&p_00->GCthreshold + 1));
    }
    pTStack_20 = (StkId)((long)L->stack + lVar3);
    if (*(lu_byte *)((long)&p_00->GCthreshold + 2) == '\0') {
      p = (Proto *)(pTStack_20 + 1);
      if ((StkId)((Value *)&p->next +
                 (long)(int)(uint)*(lu_byte *)((long)&p_00->GCthreshold + 1) * 2) < L->top) {
        L->top = (StkId)((Value *)&p->next +
                        (long)(int)(uint)*(lu_byte *)((long)&p_00->GCthreshold + 1) * 2);
      }
    }
    else {
      p = (Proto *)adjust_varargs(L,(Proto *)p_00,(int)((long)L->top - (long)pTStack_20 >> 4) + -1);
      pTStack_20 = (StkId)((long)L->stack + lVar3);
    }
    if (L->ci == L->end_ci) {
      local_78 = growCI(L);
    }
    else {
      local_78 = L->ci + 1;
      L->ci = local_78;
    }
    local_78->func = pTStack_20;
    local_78->base = (StkId)p;
    L->base = (StkId)p;
    local_78->top = L->base + (int)(uint)*(lu_byte *)((long)&p_00->GCthreshold + 3);
    L->savedpc = (Instruction *)p_00->ud;
    local_78->tailcalls = 0;
    local_78->nresults = nresults;
    for (base = L->top; base < local_78->top; base = base + 1) {
      base->tt = 0;
    }
    L->top = local_78->top;
    L_local._4_4_ = 0;
  }
  else {
    if ((long)L->stack_last - (long)L->top < 0x141) {
      luaD_growstack(L,0x14);
    }
    if (L->ci == L->end_ci) {
      local_80 = growCI(L);
    }
    else {
      local_80 = L->ci + 1;
      L->ci = local_80;
    }
    local_80->func = (StkId)((long)L->stack + lVar3);
    local_80->base = local_80->func + 1;
    L->base = local_80->func + 1;
    local_80->top = L->top + 0x14;
    local_80->nresults = nresults;
    iVar2 = (*(code *)(((L->ci->func->value).gc)->h).node)(L);
    if (iVar2 < 0) {
      L_local._4_4_ = 2;
    }
    else {
      luaD_poscall(L,L->top + -(long)iVar2);
      L_local._4_4_ = 1;
    }
  }
  return L_local._4_4_;
}

Assistant:

static int luaD_precall(lua_State*L,StkId func,int nresults){
LClosure*cl;
ptrdiff_t funcr;
if(!ttisfunction(func))
func=tryfuncTM(L,func);
funcr=savestack(L,func);
cl=&clvalue(func)->l;
L->ci->savedpc=L->savedpc;
if(!cl->isC){
CallInfo*ci;
StkId st,base;
Proto*p=cl->p;
luaD_checkstack(L,p->maxstacksize+p->numparams);
func=restorestack(L,funcr);
if(!p->is_vararg){
base=func+1;
if(L->top>base+p->numparams)
L->top=base+p->numparams;
}
else{
int nargs=cast_int(L->top-func)-1;
base=adjust_varargs(L,p,nargs);
func=restorestack(L,funcr);
}
ci=inc_ci(L);
ci->func=func;
L->base=ci->base=base;
ci->top=L->base+p->maxstacksize;
L->savedpc=p->code;
ci->tailcalls=0;
ci->nresults=nresults;
for(st=L->top;st<ci->top;st++)
setnilvalue(st);
L->top=ci->top;
return 0;
}
else{
CallInfo*ci;
int n;
luaD_checkstack(L,20);
ci=inc_ci(L);
ci->func=restorestack(L,funcr);
L->base=ci->base=ci->func+1;
ci->top=L->top+20;
ci->nresults=nresults;
n=(*curr_func(L)->c.f)(L);
if(n<0)
return 2;
else{
luaD_poscall(L,L->top-n);
return 1;
}
}
}